

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * __thiscall
ODDLParser::OpenDDLParser::parseStructureBody(OpenDDLParser *this,char *in,char *end,bool *error)

{
  DDLNode *this_00;
  byte bVar1;
  byte *pbVar2;
  pointer ppDVar3;
  char *pcVar4;
  pointer ppDVar5;
  byte *pbVar6;
  Value *values;
  DataArrayList *dtArrayList;
  Reference *refs;
  size_t arrayLen;
  ValueType type;
  size_t numValues;
  size_t numRefs;
  Value *local_80;
  DataArrayList *local_78;
  string local_70;
  size_t local_50;
  ValueType local_44;
  size_t local_40 [2];
  
  pbVar6 = (byte *)(in + ((byte)((*in & 0xdfU) + 0xa5) < 0xe6 && (byte)(*in - 0x3aU) < 0xf6));
  pbVar2 = pbVar6;
  while (((pbVar6 != (byte *)end && (pbVar2 = pbVar6, (ulong)*pbVar6 < 0x2d)) &&
         ((0x100100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
    pbVar2 = (byte *)end;
  }
  local_44 = ddl_none;
  local_50 = 0;
  pbVar6 = (byte *)parsePrimitiveDataType((char *)pbVar2,end,&local_44,&local_50);
  pbVar2 = pbVar6;
  if (local_44 == ddl_none) {
    pcVar4 = parseHeader(this,(char *)pbVar6,end);
    pcVar4 = parseStructure(this,pcVar4,end);
    return pcVar4;
  }
  for (; pbVar6 != (byte *)end; pbVar6 = pbVar6 + 1) {
    bVar1 = *pbVar6;
    pbVar2 = pbVar6;
    if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_0066ea35;
    pbVar2 = (byte *)end;
  }
  bVar1 = *pbVar2;
LAB_0066ea35:
  pbVar6 = pbVar2;
  if (bVar1 == 0x7b) {
    local_70._M_dataplus._M_p = (pointer)0x0;
    local_78 = (DataArrayList *)0x0;
    local_80 = (Value *)0x0;
    if (local_50 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"0 for array is invalid.",0x17);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      *error = true;
    }
    else if (local_50 == 1) {
      local_40[1] = 0;
      local_40[0] = 0;
      pbVar2 = (byte *)parseDataList((char *)pbVar2,end,local_44,&local_80,local_40,
                                     (Reference **)&local_70,local_40 + 1);
      ppDVar5 = (this->m_stack).
                super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppDVar3 = (this->m_stack).
                super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((ppDVar5 != ppDVar3) && (ppDVar3[-1] != (DDLNode *)0x0 && local_80 != (Value *)0x0)) {
        DDLNode::setValue(ppDVar3[-1],local_80);
        ppDVar5 = (this->m_stack).
                  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppDVar3 = (this->m_stack).
                  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      pbVar6 = pbVar2;
      if ((ppDVar5 != ppDVar3) &&
         (ppDVar3[-1] != (DDLNode *)0x0 &&
          (Reference *)local_70._M_dataplus._M_p != (Reference *)0x0)) {
        DDLNode::setReferences(ppDVar3[-1],(Reference *)local_70._M_dataplus._M_p);
      }
    }
    else {
      pbVar2 = (byte *)parseDataArrayList((char *)pbVar2,end,local_44,&local_78);
      ppDVar5 = (this->m_stack).
                super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pbVar6 = pbVar2;
      if (((this->m_stack).
           super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl
           .super__Vector_impl_data._M_start != ppDVar5) &&
         (this_00 = ppDVar5[-1], this_00 != (DDLNode *)0x0 && local_78 != (DataArrayList *)0x0)) {
        DDLNode::setDataArrayList(this_00,local_78);
      }
    }
  }
  for (; pbVar2 != (byte *)end; pbVar2 = pbVar2 + 1) {
    bVar1 = *pbVar2;
    pbVar6 = pbVar2;
    if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_0066ebcb;
    pbVar6 = (byte *)end;
  }
  bVar1 = *pbVar6;
LAB_0066ebcb:
  if (bVar1 != 0x7d) {
    local_70.field_2._M_allocated_capacity._0_2_ = 0x7d;
    local_70._M_string_length = 1;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    logInvalidTokenError((char *)pbVar6,&local_70,this->m_logCallback);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT62(local_70.field_2._M_allocated_capacity._2_6_,
                               local_70.field_2._M_allocated_capacity._0_2_) + 1);
    }
    pbVar6 = (byte *)0x0;
  }
  return (char *)pbVar6;
}

Assistant:

char *OpenDDLParser::parseStructureBody( char *in, char *end, bool &error ) {
    if( !isNumeric( *in ) && !isCharacter( *in ) ) {
        ++in;
    }

    in = lookForNextToken( in, end );
    Value::ValueType type( Value::ddl_none );
    size_t arrayLen( 0 );
    in = OpenDDLParser::parsePrimitiveDataType( in, end, type, arrayLen );
    if( Value::ddl_none != type ) {
        // parse a primitive data type
        in = lookForNextToken( in, end );
        if( *in == Grammar::OpenBracketToken[ 0 ] ) {
            Reference *refs( ddl_nullptr );
            DataArrayList *dtArrayList( ddl_nullptr );
            Value *values( ddl_nullptr );
            if( 1 == arrayLen ) {
                size_t numRefs( 0 ), numValues( 0 );
                in = parseDataList( in, end, type, &values, numValues, &refs, numRefs );
                setNodeValues( top(), values );
                setNodeReferences( top(), refs );
            } else if( arrayLen > 1 ) {
                in = parseDataArrayList( in, end, type, &dtArrayList );
                setNodeDataArrayList( top(), dtArrayList );
            } else {
                std::cerr << "0 for array is invalid." << std::endl;
                error = true;
            }
        }

        in = lookForNextToken( in, end );
        if( *in != '}' ) {
            logInvalidTokenError( in, std::string( Grammar::CloseBracketToken ), m_logCallback );
            return ddl_nullptr;
        } else {
            //in++;
        }
    } else {
        // parse a complex data type
        in = parseNextNode( in, end );
    }

    return in;
}